

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O2

int add_addr_to_dev(pcap_if_t *curdev,sockaddr *addr,size_t addr_size,sockaddr *netmask,
                   size_t netmask_size,sockaddr *broadaddr,size_t broadaddr_size,sockaddr *dstaddr,
                   size_t dstaddr_size,char *errbuf)

{
  pcap_addr *ppVar1;
  pcap_addr *__ptr;
  sockaddr *__ptr_00;
  int *piVar2;
  char *pcVar3;
  sockaddr *__ptr_01;
  sockaddr *__ptr_02;
  sockaddr *psVar4;
  pcap_addr *ppVar5;
  
  __ptr = (pcap_addr *)malloc(0x28);
  if (__ptr == (pcap_addr *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
    return -1;
  }
  __ptr->next = (pcap_addr *)0x0;
  if (addr == (sockaddr *)0x0) {
    __ptr->addr = (sockaddr *)0x0;
    __ptr_00 = (sockaddr *)0x0;
  }
  else {
    __ptr_00 = dup_sockaddr(addr,addr_size);
    __ptr->addr = __ptr_00;
    if (__ptr_00 == (sockaddr *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf(errbuf,0x100,"malloc: %s",pcVar3);
      goto LAB_0010885f;
    }
  }
  if (netmask == (sockaddr *)0x0) {
    __ptr->netmask = (sockaddr *)0x0;
    __ptr_01 = (sockaddr *)0x0;
LAB_001087b2:
    if (broadaddr == (sockaddr *)0x0) {
      __ptr->broadaddr = (sockaddr *)0x0;
      __ptr_02 = (sockaddr *)0x0;
LAB_00108805:
      if (dstaddr == (sockaddr *)0x0) {
        __ptr->dstaddr = (sockaddr *)0x0;
LAB_00108871:
        ppVar1 = curdev->addresses;
        do {
          ppVar5 = ppVar1;
          if (ppVar5 == (pcap_addr *)0x0) {
            curdev->addresses = __ptr;
            return 0;
          }
          ppVar1 = ppVar5->next;
        } while (ppVar5->next != (pcap_addr *)0x0);
        ppVar5->next = __ptr;
        return 0;
      }
      psVar4 = dup_sockaddr(dstaddr,dstaddr_size);
      __ptr->dstaddr = psVar4;
      if (psVar4 != (sockaddr *)0x0) goto LAB_00108871;
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf(errbuf,0x100,"malloc: %s",pcVar3);
      free(__ptr_02);
    }
    else {
      __ptr_02 = dup_sockaddr(broadaddr,broadaddr_size);
      __ptr->broadaddr = __ptr_02;
      if (__ptr_02 != (sockaddr *)0x0) goto LAB_00108805;
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf(errbuf,0x100,"malloc: %s",pcVar3);
    }
    free(__ptr_01);
  }
  else {
    __ptr_01 = dup_sockaddr(netmask,netmask_size);
    __ptr->netmask = __ptr_01;
    if (__ptr_01 != (sockaddr *)0x0) goto LAB_001087b2;
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
  }
  free(__ptr_00);
LAB_0010885f:
  free(__ptr);
  return -1;
}

Assistant:

int
add_addr_to_dev(pcap_if_t *curdev,
    struct sockaddr *addr, size_t addr_size,
    struct sockaddr *netmask, size_t netmask_size,
    struct sockaddr *broadaddr, size_t broadaddr_size,
    struct sockaddr *dstaddr, size_t dstaddr_size,
    char *errbuf)
{
	pcap_addr_t *curaddr, *prevaddr, *nextaddr;

	curaddr = malloc(sizeof(pcap_addr_t));
	if (curaddr == NULL) {
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "malloc: %s", pcap_strerror(errno));
		return (-1);
	}

	curaddr->next = NULL;
	if (addr != NULL) {
		curaddr->addr = dup_sockaddr(addr, addr_size);
		if (curaddr->addr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->addr = NULL;

	if (netmask != NULL) {
		curaddr->netmask = dup_sockaddr(netmask, netmask_size);
		if (curaddr->netmask == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->netmask = NULL;

	if (broadaddr != NULL) {
		curaddr->broadaddr = dup_sockaddr(broadaddr, broadaddr_size);
		if (curaddr->broadaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->broadaddr = NULL;

	if (dstaddr != NULL) {
		curaddr->dstaddr = dup_sockaddr(dstaddr, dstaddr_size);
		if (curaddr->dstaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->broadaddr != NULL)
				free(curaddr->broadaddr);
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->dstaddr = NULL;

	/*
	 * Find the end of the list of addresses.
	 */
	for (prevaddr = curdev->addresses; prevaddr != NULL; prevaddr = nextaddr) {
		nextaddr = prevaddr->next;
		if (nextaddr == NULL) {
			/*
			 * This is the end of the list.
			 */
			break;
		}
	}

	if (prevaddr == NULL) {
		/*
		 * The list was empty; this is the first member.
		 */
		curdev->addresses = curaddr;
	} else {
		/*
		 * "prevaddr" is the last member of the list; append
		 * this member to it.
		 */
		prevaddr->next = curaddr;
	}

	return (0);
}